

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void transstring(string_view *beast_str,string *shine_str)

{
  ostream *poVar1;
  stringstream sstr;
  long local_1a0 [2];
  basic_ostream<char,_std::char_traits<char>_> local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  std::ios::clear((int)(stringstream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  boost::operator<<(local_190,beast_str);
  std::operator>>((istream *)local_1a0,(string *)shine_str);
  poVar1 = std::operator<<((ostream *)&std::cout,"Here:");
  poVar1 = std::operator<<(poVar1,(string *)shine_str);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return;
}

Assistant:

void transstring(beast::string_view &beast_str, shine::string &shine_str) {
    stringstream sstr;
    sstr.clear();
    sstr << beast_str;
    sstr >> shine_str;
    std::cout << "Here:" << shine_str << std::endl;
}